

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtCompoundCollisionAlgorithm::preallocateChildAlgorithms
          (cbtCompoundCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap)

{
  uint newsize;
  cbtCollisionShape *pcVar1;
  cbtDispatcher *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  cbtCollisionObjectWrapper *pcVar4;
  ulong uVar5;
  long lVar6;
  cbtCollisionObjectWrapper *local_98;
  undefined8 local_90;
  cbtCollisionObject *local_88;
  cbtTransform *pcStack_80;
  undefined4 local_78;
  undefined4 local_74;
  cbtAlignedObjectArray<cbtCollisionAlgorithm_*> m_childCollisionAlgorithmsClosestPoints;
  cbtAlignedObjectArray<cbtCollisionAlgorithm_*> m_childCollisionAlgorithmsContact;
  
  pcVar4 = body1Wrap;
  if (this->m_isSwapped != false) {
    pcVar4 = body0Wrap;
    body0Wrap = body1Wrap;
  }
  pcVar1 = body0Wrap->m_shape;
  newsize = *(uint *)((long)&pcVar1[1]._vptr_cbtCollisionShape + 4);
  local_98 = (cbtCollisionObjectWrapper *)0x0;
  cbtAlignedObjectArray<cbtCollisionAlgorithm_*>::resize
            (&this->m_childCollisionAlgorithms,newsize,(cbtCollisionAlgorithm **)&local_98);
  lVar6 = 0x40;
  for (uVar5 = 0; (~((int)newsize >> 0x1f) & newsize) != uVar5; uVar5 = uVar5 + 1) {
    if (pcVar1[3]._vptr_cbtCollisionShape == (_func_int **)0x0) {
      local_90 = *(undefined8 *)((long)pcVar1[1].m_userPointer + lVar6);
      local_88 = body0Wrap->m_collisionObject;
      pcStack_80 = body0Wrap->m_worldTransform;
      local_78 = 0xffffffff;
      local_74 = (undefined4)uVar5;
      pcVar2 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
               m_dispatcher;
      local_98 = body0Wrap;
      iVar3 = (*pcVar2->_vptr_cbtDispatcher[2])(pcVar2,&local_98,pcVar4,this->m_sharedManifold,1);
      (this->m_childCollisionAlgorithms).m_data[uVar5] =
           (cbtCollisionAlgorithm *)CONCAT44(extraout_var,iVar3);
      m_childCollisionAlgorithmsContact.m_ownsMemory = true;
      m_childCollisionAlgorithmsContact.m_data = (cbtCollisionAlgorithm **)0x0;
      m_childCollisionAlgorithmsClosestPoints.m_ownsMemory = true;
      m_childCollisionAlgorithmsClosestPoints.m_data = (cbtCollisionAlgorithm **)0x0;
      m_childCollisionAlgorithmsContact.m_size = 0;
      m_childCollisionAlgorithmsContact.m_capacity = 0;
      m_childCollisionAlgorithmsClosestPoints.m_size = 0;
      m_childCollisionAlgorithmsClosestPoints.m_capacity = 0;
      cbtAlignedObjectArray<cbtCollisionAlgorithm_*>::~cbtAlignedObjectArray
                (&m_childCollisionAlgorithmsClosestPoints);
      cbtAlignedObjectArray<cbtCollisionAlgorithm_*>::~cbtAlignedObjectArray
                (&m_childCollisionAlgorithmsContact);
    }
    else {
      (this->m_childCollisionAlgorithms).m_data[uVar5] = (cbtCollisionAlgorithm *)0x0;
    }
    lVar6 = lVar6 + 0x58;
  }
  return;
}

Assistant:

void cbtCompoundCollisionAlgorithm::preallocateChildAlgorithms(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap)
{
	const cbtCollisionObjectWrapper* colObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* otherObjWrap = m_isSwapped ? body0Wrap : body1Wrap;
	cbtAssert(colObjWrap->getCollisionShape()->isCompound());

	const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(colObjWrap->getCollisionShape());

	int numChildren = compoundShape->getNumChildShapes();
	int i;

	m_childCollisionAlgorithms.resize(numChildren);
	for (i = 0; i < numChildren; i++)
	{
		if (compoundShape->getDynamicAabbTree())
		{
			m_childCollisionAlgorithms[i] = 0;
		}
		else
		{
			const cbtCollisionShape* childShape = compoundShape->getChildShape(i);

			cbtCollisionObjectWrapper childWrap(colObjWrap, childShape, colObjWrap->getCollisionObject(), colObjWrap->getWorldTransform(), -1, i);  //wrong child trans, but unused (hopefully)
			m_childCollisionAlgorithms[i] = m_dispatcher->findAlgorithm(&childWrap, otherObjWrap, m_sharedManifold, BT_CONTACT_POINT_ALGORITHMS);

			cbtAlignedObjectArray<cbtCollisionAlgorithm*> m_childCollisionAlgorithmsContact;
			cbtAlignedObjectArray<cbtCollisionAlgorithm*> m_childCollisionAlgorithmsClosestPoints;
		}
	}
}